

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_dictionary_utils.cpp
# Opt level: O2

void bidfx_public_api::price::pixie::DataDictionaryUtils::AddAllFields
               (IDataDictionary *data_dictionary,
               vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
               *field_defs)

{
  pointer pFVar1;
  pointer to_copy;
  undefined1 auStack_58 [48];
  
  pFVar1 = (field_defs->
           super__Vector_base<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (to_copy = (field_defs->
                 super__Vector_base<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
                 )._M_impl.super__Vector_impl_data._M_start; to_copy != pFVar1;
      to_copy = to_copy + 1) {
    FieldDef::FieldDef((FieldDef *)auStack_58,to_copy);
    (*data_dictionary->_vptr_IDataDictionary[2])(data_dictionary,auStack_58);
    std::__cxx11::string::~string((string *)(auStack_58 + 8));
  }
  return;
}

Assistant:

void DataDictionaryUtils::AddAllFields(IDataDictionary& data_dictionary,
                                       std::vector<FieldDef>& field_defs)
{
    for (const auto& curr_field_def : field_defs)
    {
        data_dictionary.AddFieldDef(curr_field_def);
    }
}